

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean MA_free_heap_piece(Integer memhandle,Integer nelem)

{
  Boolean BVar1;
  ulong uVar2;
  ulongi bytes_extra;
  ulong uVar3;
  long lVar4;
  AD *ad;
  ulongi nbytes;
  Pointer client_space;
  AR ar;
  
  ma_stats.calls[4] = ma_stats.calls[4] + 1;
  BVar1 = mh2ad(memhandle,&ad,BL_Heap,"MA_free_heap_piece");
  if (BVar1 == 0) {
    BVar1 = 0;
  }
  else if (nelem < 0) {
    BVar1 = 0;
    sprintf(ma_ebuf,"block \'%s\', invalid nelem: %ld",ad->name,nelem);
    ma_error(EL_Nonfatal,ET_External,"MA_free_heap_piece",ma_ebuf);
  }
  else {
    lVar4 = ad->nelem;
    if (lVar4 <= nelem) {
      BVar1 = MA_free_heap(memhandle);
      return BVar1;
    }
    if (ma_trace != 0) {
      printf("MA: freeing %ld elements of \'%s\'\n",nelem,ad->name);
      lVar4 = ad->nelem;
    }
    ar.datatype = ad->datatype;
    lVar4 = lVar4 - nelem;
    ar.nelem = lVar4;
    balloc_after(&ar,(Pointer)ad,&client_space,&nbytes);
    uVar2 = ad->nbytes;
    uVar3 = uVar2 - nbytes;
    if ((nbytes <= uVar2 && uVar3 != 0) && (0x5f < uVar3)) {
      *(ulong *)(ad->name + nbytes + 0x28) = uVar3;
      ad->nbytes = nbytes;
      ma_stats.hbytes = ma_stats.hbytes - *(long *)(ad->name + nbytes + 0x28);
      block_free_heap((AD *)(ad->name + (nbytes - 0x10)));
      uVar2 = ad->nbytes;
    }
    ad->nelem = lVar4;
    ad->checksum = (ulongi)(ad->client_space + uVar2 + lVar4 + ad->datatype);
    guard_set(ad);
    BVar1 = 1;
  }
  return BVar1;
}

Assistant:

public Boolean MA_free_heap_piece(
    Integer    memhandle,    /* the block to deallocate a piece of */
    Integer    nelem         /* # of elements to deallocate */)
{
    AD        *ad;        /* AD for memhandle */
    AD        *ad_reclaim;    /* AD for data returned */
    AR        ar;        /* AR for data kept */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for data kept */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_free_heap_piece]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_Heap, "MA_free_heap_piece"))
        return MA_FALSE;

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            ad->name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_free_heap_piece", ma_ebuf);
        return MA_FALSE;
    }
    else if (nelem >= ad->nelem)
    {
        /* deallocate the whole block */
        return MA_free_heap(memhandle);
    }

    if (ma_trace) 
    (void)printf("MA: freeing %ld elements of '%s'\n",
            (size_t)nelem, ad->name);

    /* set AR for data to keep */
    ar.datatype = ad->datatype;
    ar.nelem = ad->nelem - nelem;

    /* perform trial allocation to determine size */
    balloc_after(&ar, (Pointer)ad, &client_space, &nbytes);

    if (nbytes < ad->nbytes)
    {
        /* ad has extra space; split block if possible */
        ad_reclaim = block_split(ad, nbytes, (Boolean)MA_FALSE);

        if (ad_reclaim)
        {
#ifdef STATS
            ma_stats.hbytes -= ad_reclaim->nbytes;
#endif /* STATS */

            /* reclaim the deallocated (new) block */
            block_free_heap(ad_reclaim);
        }
    }

    /* update surviving block */
    ad->nelem = ar.nelem;
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* success */
    return MA_TRUE;
}